

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::InterceptorConfig::InterceptorConfig
          (InterceptorConfig *this,InterceptorConfig *param_1)

{
  InterceptorConfig *param_1_local;
  InterceptorConfig *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj,&param_1->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__InterceptorConfig_009c16f8;
  ::std::__cxx11::string::string((string *)&this->name_,(string *)&param_1->name_);
  ::std::__cxx11::string::string
            ((string *)&this->console_config_,(string *)&param_1->console_config_);
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<2UL>._M_w[0] =
       (param_1->_has_field_).super__Base_bitset<2UL>._M_w[0];
  (this->_has_field_).super__Base_bitset<2UL>._M_w[1] =
       (param_1->_has_field_).super__Base_bitset<2UL>._M_w[1];
  return;
}

Assistant:

InterceptorConfig::InterceptorConfig(InterceptorConfig&&) noexcept = default;